

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

int __thiscall CGraphics_Threaded::IssueInit(CGraphics_Threaded *this)

{
  CConfig *pCVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  
  pCVar1 = this->m_pConfig;
  bVar5 = pCVar1->m_GfxBorderless != 0;
  bVar6 = pCVar1->m_GfxFullscreen != 0;
  uVar4 = bVar6 + 2 + (uint)bVar5 * 8;
  if (pCVar1->m_GfxVsync == 0) {
    uVar4 = (uint)bVar6 + (uint)bVar5 * 8;
  }
  uVar2 = uVar4 + 0x20;
  if (pCVar1->m_GfxHighdpi == 0) {
    uVar2 = uVar4;
  }
  uVar4 = uVar2 | 4;
  if (pCVar1->m_DbgResizable == 0) {
    uVar4 = uVar2;
  }
  uVar2 = uVar4 | 0x10;
  if (pCVar1->m_GfxUseX11XRandRWM == 0) {
    uVar2 = uVar4;
  }
  iVar3 = (*this->m_pBackend->_vptr_IGraphicsBackend[2])
                    (this->m_pBackend,"Teeworlds",&pCVar1->m_GfxScreen,&pCVar1->m_GfxScreenWidth,
                     &pCVar1->m_GfxScreenHeight,&this->field_0x10,&this->field_0x14,
                     (ulong)(uint)pCVar1->m_GfxFsaaSamples,(ulong)uVar2,&this->field_0x18,
                     &this->field_0x1c);
  return iVar3;
}

Assistant:

int CGraphics_Threaded::IssueInit()
{
	int Flags = 0;
	if(m_pConfig->m_GfxBorderless) Flags |= IGraphicsBackend::INITFLAG_BORDERLESS;
	if(m_pConfig->m_GfxFullscreen) Flags |= IGraphicsBackend::INITFLAG_FULLSCREEN;
	if(m_pConfig->m_GfxVsync) Flags |= IGraphicsBackend::INITFLAG_VSYNC;
	if(m_pConfig->m_GfxHighdpi) Flags |= IGraphicsBackend::INITFLAG_HIGHDPI;
	if(m_pConfig->m_DbgResizable) Flags |= IGraphicsBackend::INITFLAG_RESIZABLE;
	if(m_pConfig->m_GfxUseX11XRandRWM) Flags |= IGraphicsBackend::INITFLAG_X11XRANDR;

	return m_pBackend->Init("Teeworlds", &m_pConfig->m_GfxScreen, &m_pConfig->m_GfxScreenWidth,
			&m_pConfig->m_GfxScreenHeight, &m_ScreenWidth, &m_ScreenHeight, m_pConfig->m_GfxFsaaSamples,
			Flags, &m_DesktopScreenWidth, &m_DesktopScreenHeight);
}